

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_libmeshb_block.c
# Opt level: O0

int main(void)

{
  int64_t iVar1;
  ulong uVar2;
  void *__ptr;
  void *__ptr_00;
  void *__ptr_01;
  void *__ptr_02;
  void *pvVar3;
  long lVar4;
  float (*VerTab) [3];
  int64_t OutMsh;
  int64_t InpMsh;
  int (*TriTab) [4];
  int (*QadTab) [5];
  int *RefTab;
  int dim;
  int ver;
  int NmbQad;
  int NmbVer;
  int i;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffff34;
  undefined8 in_stack_ffffffffffffff48;
  undefined4 uVar7;
  undefined8 uVar6;
  uint local_40;
  uint local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  
  uVar5 = (undefined4)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  local_2c = 0;
  iVar1 = GmfOpenMesh("../sample_meshes/quad.meshb",1,&local_3c,&local_40);
  if (iVar1 == 0) {
    local_2c = 1;
  }
  else {
    printf("InpMsh : idx = %ld, version = %d, dimension = %d\n",iVar1,(ulong)local_3c,
           (ulong)local_40);
    if (local_40 != 3) {
      exit(1);
    }
    uVar2 = GmfStatKwd(iVar1,4);
    local_34 = (int)uVar2;
    printf("InpMsh : nmb vertices = %d\n",uVar2 & 0xffffffff);
    __ptr = malloc((long)((local_34 + 1) * 3) << 2);
    __ptr_00 = malloc((long)(local_34 + 1) << 2);
    uVar2 = GmfStatKwd(iVar1,7);
    local_38 = (int)uVar2;
    printf("InpMsh : nmb quads = %d\n",uVar2 & 0xffffffff);
    __ptr_01 = malloc((long)((local_38 + 1) * 5) << 2);
    __ptr_02 = malloc((long)((local_38 + 1) * 8) << 2);
    lVar4 = (long)__ptr + 0xc;
    GmfGetBlock(iVar1,4,1,(long)local_34,0,(void *)0x0,(void *)0x0,8,lVar4,
                (void *)((long)__ptr + (long)local_34 * 0xc),CONCAT44(uVar5,8),(long)__ptr + 0x10,
                (long)__ptr + (long)local_34 * 0xc + 4,8,(long)__ptr + 0x14,
                (long)__ptr + (long)local_34 * 0xc + 8,10,(long)__ptr_00 + 4,
                (void *)((long)__ptr_00 + (long)local_34 * 4));
    pvVar3 = (void *)((long)__ptr_01 + (long)local_38 * 0x14);
    uVar5 = 0xe;
    GmfGetBlock(iVar1,7,1,(long)local_38,0,(void *)0x0,(void *)0x0,0xe,
                CONCAT44((int)((ulong)lVar4 >> 0x20),5),(long)__ptr_01 + 0x14,pvVar3);
    uVar7 = (undefined4)((ulong)pvVar3 >> 0x20);
    GmfCloseMesh(CONCAT44(in_stack_ffffffffffffff34,uVar5));
    for (local_30 = 1; local_30 <= local_38; local_30 = local_30 + 1) {
      *(undefined4 *)((long)__ptr_02 + (long)(local_30 * 2 + -1) * 0x10) =
           *(undefined4 *)((long)__ptr_01 + (long)local_30 * 0x14);
      *(undefined4 *)((long)__ptr_02 + (long)(local_30 * 2 + -1) * 0x10 + 4) =
           *(undefined4 *)((long)__ptr_01 + (long)local_30 * 0x14 + 4);
      *(undefined4 *)((long)__ptr_02 + (long)(local_30 * 2 + -1) * 0x10 + 8) =
           *(undefined4 *)((long)__ptr_01 + (long)local_30 * 0x14 + 8);
      *(undefined4 *)((long)__ptr_02 + (long)(local_30 * 2 + -1) * 0x10 + 0xc) =
           *(undefined4 *)((long)__ptr_01 + (long)local_30 * 0x14 + 0x10);
      *(undefined4 *)((long)__ptr_02 + (long)(local_30 << 1) * 0x10) =
           *(undefined4 *)((long)__ptr_01 + (long)local_30 * 0x14);
      *(undefined4 *)((long)__ptr_02 + (long)(local_30 << 1) * 0x10 + 4) =
           *(undefined4 *)((long)__ptr_01 + (long)local_30 * 0x14 + 8);
      *(undefined4 *)((long)__ptr_02 + (long)(local_30 << 1) * 0x10 + 8) =
           *(undefined4 *)((long)__ptr_01 + (long)local_30 * 0x14 + 0xc);
      *(undefined4 *)((long)__ptr_02 + (long)(local_30 << 1) * 0x10 + 0xc) =
           *(undefined4 *)((long)__ptr_01 + (long)local_30 * 0x14 + 0x10);
    }
    iVar1 = GmfOpenMesh("tri.meshb",2,(ulong)local_3c,(ulong)local_40);
    if (iVar1 == 0) {
      local_2c = 1;
    }
    else {
      GmfSetKwd(iVar1,4,(long)local_34);
      uVar6 = CONCAT44(uVar7,8);
      GmfSetBlock(iVar1,4,1,(long)local_34,0,(void *)0x0,(void *)0x0,8,(long)__ptr + 0xc,
                  (void *)((long)__ptr + (long)local_34 * 0xc),uVar6,(long)__ptr + 0x10,
                  (long)__ptr + (long)local_34 * 0xc + 4,8,(long)__ptr + 0x14,
                  (long)__ptr + (long)local_34 * 0xc + 8,10,(long)__ptr_00 + 4,
                  (void *)((long)__ptr_00 + (long)local_34 * 4));
      uVar7 = (undefined4)((ulong)uVar6 >> 0x20);
      GmfSetKwd(iVar1,6,(long)(local_38 << 1));
      uVar5 = 10;
      GmfSetBlock(iVar1,6,1,(long)(local_38 << 1),0,(void *)0x0,(void *)0x0,10,(long)__ptr_02 + 0x10
                  ,(void *)((long)__ptr_02 + (long)(local_38 << 1) * 0x10),CONCAT44(uVar7,10),
                  (long)__ptr_02 + 0x14,(long)__ptr_02 + (long)(local_38 << 1) * 0x10 + 4,10,
                  (long)__ptr_02 + 0x18,(long)__ptr_02 + (long)(local_38 << 1) * 0x10 + 8,10,
                  (long)__ptr_02 + 0x1c,(long)__ptr_02 + (long)(local_38 << 1) * 0x10 + 0xc);
      GmfCloseMesh(CONCAT44(in_stack_ffffffffffffff34,uVar5));
      printf("OutMsh : nmb triangles = %d\n",(ulong)(uint)(local_38 << 1));
      free(__ptr_01);
      free(__ptr_02);
      free(__ptr_00);
      free(__ptr);
      local_2c = 0;
    }
  }
  return local_2c;
}

Assistant:

int main()
{
   int   i, NmbVer, NmbQad, ver, dim, *RefTab, (*QadTab)[5], (*TriTab)[4];
   //int   TypTab[ GmfMaxTyp ], SizTab[ GmfMaxTyp ];
   //void *BegTab[ GmfMaxTyp ], *EndTab[ GmfMaxTyp ];
   int64_t InpMsh, OutMsh;
   float (*VerTab)[3];


   /*-----------------------------------*/
   /* Open mesh file "quad.meshb"       */
   /*-----------------------------------*/

   if(!(InpMsh = GmfOpenMesh("../sample_meshes/quad.meshb", GmfRead, &ver, &dim)))
      return(1);

   printf("InpMsh : idx = "INT64_T_FMT", version = %d, dimension = %d\n", InpMsh, ver, dim);

   if(dim != 3)
      exit(1);

   // Read the number of vertices and allocate memory
   NmbVer = (int)GmfStatKwd(InpMsh, GmfVertices);
   printf("InpMsh : nmb vertices = %d\n", NmbVer);
   VerTab = malloc((NmbVer+1) * 3 * sizeof(float));
   RefTab = malloc((NmbVer+1) * sizeof(int));

   // Read the number of quads and allocate memory
   NmbQad = (int)GmfStatKwd(InpMsh, GmfQuadrilaterals);
   printf("InpMsh : nmb quads = %d\n", NmbQad);
   QadTab = malloc((NmbQad+1) * 5 * sizeof(int));
   TriTab = malloc((NmbQad+1) * 2 * 4 * sizeof(int));

   // Read the vertices: choose one of the four available methods

   // First method: argument list with scalar pointers
   GmfGetBlock(InpMsh, GmfVertices, 1, NmbVer, 0, NULL, NULL,
            GmfFloat, &VerTab[1][0], &VerTab[ NmbVer ][0],
            GmfFloat, &VerTab[1][1], &VerTab[ NmbVer ][1],
            GmfFloat, &VerTab[1][2], &VerTab[ NmbVer ][2],
            GmfInt,   &RefTab[1],    &RefTab[ NmbVer ] );

   // 2nd method: argument list with vector pointers
   /*GmfGetBlock(InpMsh, GmfVertices, 1, NmbVer, 0, NULL, NULL,
               GmfFloatVec, 3, &VerTab[1][0], &VerTab[ NmbVer ][0],
               GmfInt,         &RefTab[1],    &RefTab[ NmbVer ] );*/

   // 3rd method: argument table with scalar pointers
   /*TypTab[0] = GmfFloat;
   BegTab[0] = (void *)&VerTab[      1 ][0];
   EndTab[0] = (void *)&VerTab[ NmbVer ][0];

   TypTab[1] = GmfFloat;
   BegTab[1] = (void *)&VerTab[      1 ][1];
   EndTab[1] = (void *)&VerTab[ NmbVer ][1];

   TypTab[2] = GmfFloat;
   BegTab[2] = (void *)&VerTab[      1 ][2];
   EndTab[2] = (void *)&VerTab[ NmbVer ][2];

   TypTab[3] = GmfInt;
   BegTab[3] = (void *)&RefTab[      1 ];
   EndTab[3] = (void *)&RefTab[ NmbVer ];

   GmfGetBlock(InpMsh, GmfVertices, 1, NmbVer, 0, NULL, NULL,
               GmfArgTab, TypTab, SizTab, BegTab, EndTab );*/

   // 4th method: argument table with vector pointers
   /*TypTab[0] = GmfFloatVec;
   SizTab[0] = 3;
   BegTab[0] = (void *)&VerTab[      1 ][0];
   EndTab[0] = (void *)&VerTab[ NmbVer ][0];

   TypTab[1] = GmfInt;
   BegTab[1] = (void *)&RefTab[      1 ];
   EndTab[1] = (void *)&RefTab[ NmbVer ];

   GmfGetBlock(InpMsh, GmfVertices, 1, NmbVer, 0, NULL, NULL,
               GmfArgTab, TypTab, SizTab, BegTab, EndTab );*/

   // Read the quads
   GmfGetBlock(InpMsh, GmfQuadrilaterals, 1, NmbQad, 0, NULL, NULL,
               GmfIntVec, 5, &QadTab[1][0], &QadTab[ NmbQad ][0]);

   // Close the quad mesh
   GmfCloseMesh(InpMsh);


   /*-----------------------------------*/
   /* Create the triangluated mesh      */
   /*-----------------------------------*/

   for(i=1;i<=NmbQad;i++)
   {
      TriTab[i*2-1][0] = QadTab[i][0];
      TriTab[i*2-1][1] = QadTab[i][1];
      TriTab[i*2-1][2] = QadTab[i][2];
      TriTab[i*2-1][3] = QadTab[i][4];

      TriTab[i*2][0] = QadTab[i][0];
      TriTab[i*2][1] = QadTab[i][2];
      TriTab[i*2][2] = QadTab[i][3];
      TriTab[i*2][3] = QadTab[i][4];
   }


   /*-----------------------------------*/
   /* Write the triangle mesh           */
   /*-----------------------------------*/

   if(!(OutMsh = GmfOpenMesh("tri.meshb", GmfWrite, ver, dim)))
      return(1);

   // Write the vertices
   GmfSetKwd(OutMsh, GmfVertices, NmbVer);
   GmfSetBlock(OutMsh, GmfVertices, 1, NmbVer, 0, NULL, NULL,
               GmfFloat, &VerTab[1][0], &VerTab[ NmbVer ][0],
               GmfFloat, &VerTab[1][1], &VerTab[ NmbVer ][1],
               GmfFloat, &VerTab[1][2], &VerTab[ NmbVer ][2],
               GmfInt,   &RefTab[1],    &RefTab[ NmbVer ] );

   // Write the triangles
   GmfSetKwd(OutMsh, GmfTriangles, 2*NmbQad);
   GmfSetBlock(OutMsh, GmfTriangles, 1, 2*NmbQad, 0, NULL, NULL,
               GmfInt, &TriTab[1][0], &TriTab[ 2*NmbQad ][0],
               GmfInt, &TriTab[1][1], &TriTab[ 2*NmbQad ][1],
               GmfInt, &TriTab[1][2], &TriTab[ 2*NmbQad ][2],
               GmfInt, &TriTab[1][3], &TriTab[ 2*NmbQad ][3] );

   // Do not forget to close the mesh file
   GmfCloseMesh(OutMsh);
   printf("OutMsh : nmb triangles = %d\n", 2*NmbQad);

   free(QadTab);
   free(TriTab);
   free(RefTab);
   free(VerTab);

   return(0);
}